

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stop_bit.cpp
# Opt level: O2

ssize_t cornelich::util::stop_bit::write(int __fd,void *__buf,size_t __n)

{
  int iVar1;
  ulong uVar2;
  undefined4 in_register_0000003c;
  
  if (0x7f < __n) {
    if (0x3fff < __n) {
      for (uVar2 = (long)__n >> 0x3f ^ __n; 0x7f < uVar2; uVar2 = uVar2 >> 7) {
        iVar1 = *__buf;
        *(int *)__buf = iVar1 + 1;
        *(byte *)(CONCAT44(in_register_0000003c,__fd) + (long)iVar1) = (byte)uVar2 | 0x80;
      }
      if ((long)__n < 0) {
        iVar1 = *__buf;
        *(int *)__buf = iVar1 + 1;
        *(byte *)(CONCAT44(in_register_0000003c,__fd) + (long)iVar1) = (byte)uVar2 | 0x80;
        uVar2 = 0;
      }
      goto LAB_00126bdf;
    }
    iVar1 = *__buf;
    *(int *)__buf = iVar1 + 1;
    *(byte *)(CONCAT44(in_register_0000003c,__fd) + (long)iVar1) = (byte)__n | 0x80;
    __n = __n >> 7 & 0x1ffffff;
  }
  uVar2 = __n & 0xffffffff;
LAB_00126bdf:
  iVar1 = *__buf;
  *(int *)__buf = iVar1 + 1;
  *(char *)(CONCAT44(in_register_0000003c,__fd) + (long)iVar1) = (char)uVar2;
  return uVar2;
}

Assistant:

void write(std::uint8_t * buffer, std::int32_t & offset, std::int64_t value)
{
    if((value & ~0x7F) == 0)
    {
        buffer[offset++] = value & 0x7f;
        return;
    }
    if((value & ~0x3FFF) == 0)
    {
        buffer[offset++] = static_cast<std::uint8_t>(value & 0x7f) | 0x80;
        buffer[offset++] = static_cast<std::uint8_t>(value >> 7);
        return;
    }
    auto neg = false;
    if(value < 0)
    {
        neg = true;
        value = ~value;
    }
    std::uint64_t n2;
    while ((n2 = static_cast<std::uint64_t>(value >> 7)) != 0)
    {
        buffer[offset++] = static_cast<std::uint8_t>(0x80L | value);
        value = static_cast<std::int64_t>(n2);
    }
    // final byte
    if (!neg)
        buffer[offset++] = static_cast<std::uint8_t>(value);
    else
    {
        buffer[offset++] = static_cast<std::uint8_t>(0x80 | value);
        buffer[offset++] = 0;
    }
}